

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O2

optional<n_e_s::core::Pixel> __thiscall n_e_s::core::Ppu::pixel(Ppu *this)

{
  ushort uVar1;
  int iVar2;
  PpuRegisters *pPVar3;
  ulong uVar4;
  uint uVar5;
  byte bVar6;
  
  pPVar3 = this->registers_;
  uVar1 = pPVar3->cycle;
  uVar5 = (uint)uVar1;
  uVar4 = (ulong)(uVar1 - 1);
  if ((ushort)(uVar1 - 1) < 0x100) {
    bVar6 = (pPVar3->mask).super_Register<unsigned_char>.value_;
    uVar5 = 0x3f00;
    if (((bVar6 & 8) == 0) || (uVar1 < 9 && (bVar6 & 2) == 0)) {
      uVar1 = 0;
    }
    else {
      uVar5 = 0x8000 >> (pPVar3->fine_x_scroll & 0x1f);
      bVar6 = ((uVar5 & pPVar3->pattern_table_shifter_hi) != 0) * '\x02' |
              (uVar5 & pPVar3->pattern_table_shifter_low) != 0;
      uVar5 = (uint)((uVar5 & pPVar3->attribute_table_shifter_low) != 0) * 4 +
              (uint)((uVar5 & pPVar3->attribute_table_shifter_hi) != 0) * 8 | 0x3f00;
      if (bVar6 == 0) {
        uVar5 = 0x3f00;
      }
      uVar1 = (ushort)bVar6;
    }
    iVar2 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)(uVar5 + uVar1));
    pPVar3 = (PpuRegisters *)
             (ulong)*(uint3 *)(::(anonymous_namespace)::kPalette + (ulong)((byte)iVar2 & 0x3f) * 3);
    uVar5 = (uint)(byte)this->registers_->scanline;
    uVar4 = (ulong)(byte)((char)this->registers_->cycle - 1);
    bVar6 = 1;
  }
  else {
    bVar6 = 0;
  }
  return (_Optional_base<n_e_s::core::Pixel,_true,_true>)
         ((uint6)uVar4 & 0xff |
         (uint6)((uVar5 & 0xff) << 8) |
         (uint6)((uint)pPVar3 & 0xffffff) << 0x10 | (uint6)bVar6 << 0x28);
}

Assistant:

uint16_t &Ppu::cycle() {
    return registers_->cycle;
}